

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QTreeViewItem>::insert
          (QMovableArrayOps<QTreeViewItem> *this,qsizetype i,qsizetype n,parameter_type t)

{
  qsizetype *pqVar1;
  long lVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  quintptr qVar6;
  QAbstractItemModel *pQVar7;
  undefined8 uVar8;
  QTreeViewItem *pQVar9;
  long lVar10;
  qsizetype inserts;
  long in_FS_OFFSET;
  bool bVar11;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = *(undefined8 *)&t->field_0x20;
  uVar4 = (t->index).r;
  uVar5 = (t->index).c;
  qVar6 = (t->index).i;
  pQVar7 = (t->index).m.ptr;
  uVar8 = *(undefined8 *)&t->parentItem;
  bVar11 = (this->super_QGenericArrayOps<QTreeViewItem>).super_QArrayDataPointer<QTreeViewItem>.size
           != 0;
  QArrayDataPointer<QTreeViewItem>::detachAndGrow
            ((QArrayDataPointer<QTreeViewItem> *)this,(uint)(i == 0 && bVar11),n,
             (QTreeViewItem **)0x0,(QArrayDataPointer<QTreeViewItem> *)0x0);
  if (i == 0 && bVar11) {
    if (n != 0) {
      pQVar9 = (this->super_QGenericArrayOps<QTreeViewItem>).super_QArrayDataPointer<QTreeViewItem>.
               ptr;
      do {
        *(undefined8 *)&pQVar9[-1].field_0x20 = uVar3;
        pQVar9[-1].index.m.ptr = pQVar7;
        *(undefined8 *)&pQVar9[-1].parentItem = uVar8;
        pQVar9[-1].index.r = uVar4;
        pQVar9[-1].index.c = uVar5;
        pQVar9[-1].index.i = qVar6;
        pQVar9 = (this->super_QGenericArrayOps<QTreeViewItem>).
                 super_QArrayDataPointer<QTreeViewItem>.ptr;
        pqVar1 = &(this->super_QGenericArrayOps<QTreeViewItem>).
                  super_QArrayDataPointer<QTreeViewItem>.size;
        *pqVar1 = *pqVar1 + 1;
        pQVar9 = pQVar9 + -1;
        (this->super_QGenericArrayOps<QTreeViewItem>).super_QArrayDataPointer<QTreeViewItem>.ptr =
             pQVar9;
        n = n + -1;
      } while (n != 0);
    }
  }
  else {
    pQVar9 = (this->super_QGenericArrayOps<QTreeViewItem>).super_QArrayDataPointer<QTreeViewItem>.
             ptr + i;
    memmove(pQVar9 + n,pQVar9,
            ((this->super_QGenericArrayOps<QTreeViewItem>).super_QArrayDataPointer<QTreeViewItem>.
             size - i) * 0x28);
    lVar10 = n;
    if (n != 0) {
      do {
        *(undefined8 *)&pQVar9->field_0x20 = uVar3;
        (pQVar9->index).m.ptr = pQVar7;
        *(undefined8 *)&pQVar9->parentItem = uVar8;
        (pQVar9->index).r = uVar4;
        (pQVar9->index).c = uVar5;
        (pQVar9->index).i = qVar6;
        pQVar9 = pQVar9 + 1;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    pqVar1 = &(this->super_QGenericArrayOps<QTreeViewItem>).super_QArrayDataPointer<QTreeViewItem>.
              size;
    *pqVar1 = *pqVar1 + n;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }